

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bup.cpp
# Opt level: O0

int processBup(istream *in,path *output)

{
  bool bVar1;
  reference pBVar2;
  reference pvVar3;
  pointer pBVar4;
  ulong uVar5;
  size_type sVar6;
  path *in_RDI;
  Point mouthPos;
  Image withMouth;
  value_type *mouth;
  int i_1;
  bool atLeastOneMouth;
  Point facePos;
  BupExpressionChunk *expChunk;
  iterator __end1_1;
  iterator __begin1_1;
  vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *__range1_1;
  Image withEyes;
  Point pos;
  size_t i;
  BupChunk *chunk;
  iterator __end1;
  iterator __begin1;
  vector<BupChunk,_std::allocator<BupChunk>_> *__range1;
  vector<MaskRect,_std::allocator<MaskRect>_> maskData;
  Image currentChunk;
  Image base;
  BupHeader header;
  unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> out;
  string outTemplate;
  path outputDir;
  Image *in_stack_fffffffffffffa58;
  Point in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  uint32_t in_stack_fffffffffffffa6c;
  path *in_stack_fffffffffffffa70;
  path *in_stack_fffffffffffffa80;
  path *in_stack_fffffffffffffa88;
  Size in_stack_fffffffffffffa90;
  Point in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  uint32_t in_stack_fffffffffffffaa4;
  path *in_stack_fffffffffffffaa8;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_fffffffffffffab0;
  string local_510 [32];
  string local_4f0 [7];
  undefined1 in_stack_fffffffffffffb17;
  string *in_stack_fffffffffffffb18;
  istream *in_stack_fffffffffffffb20;
  uint32_t in_stack_fffffffffffffb2c;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_fffffffffffffb30;
  Image *in_stack_fffffffffffffb38;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_fffffffffffffb48;
  Image *in_stack_fffffffffffffb50;
  Image *in_stack_fffffffffffffb58;
  Point in_stack_fffffffffffffb60;
  string local_490 [32];
  Point local_470;
  const_reference local_448;
  uint local_440;
  byte local_439;
  undefined1 local_438 [31];
  undefined1 local_419 [37];
  undefined4 local_3f4;
  undefined4 uStack_3f0;
  undefined4 local_3ec;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  istream *in_stack_fffffffffffffc20;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  Point local_358;
  reference local_350;
  BupExpressionChunk *local_348;
  __normal_iterator<BupExpressionChunk_*,_std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>_>
  local_340;
  undefined1 *local_338;
  undefined4 local_32c;
  undefined4 local_328;
  undefined4 uStack_324;
  string local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [47];
  allocator<char> local_291;
  string local_290 [32];
  string local_270 [136];
  Point local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  Point local_180;
  long local_178;
  reference local_170;
  BupChunk *local_168;
  __normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_> local_160;
  vector<BupChunk,_std::allocator<BupChunk>_> *local_158;
  undefined1 local_150 [28];
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined1 local_128 [36];
  undefined4 local_104;
  uint local_100;
  uint uStack_fc;
  ushort local_d2;
  ushort local_d0;
  vector<BupChunk,_std::allocator<BupChunk>_> local_c8;
  undefined1 auStack_b0 [88];
  string local_58 [80];
  path *local_8;
  
  local_8 = in_RDI;
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::stem(in_stack_fffffffffffffaa8);
  std::filesystem::__cxx11::path::string(in_stack_fffffffffffffa88);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffa60);
  if ((SAVE_BUP_AS_PARTS & 1U) == 0) {
    BupOutputter::makeComposited();
  }
  else {
    BupOutputter::makeParts();
  }
  BupHeader::BupHeader((BupHeader *)in_stack_fffffffffffffa60);
  operator>>(in_stack_fffffffffffffc20,
             (BupHeader *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  local_100 = (uint)local_d2;
  uStack_fc = (uint)local_d0;
  local_104 = 0;
  Image::Image((Image *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa90,
               SUB84((ulong)in_stack_fffffffffffffa88 >> 0x20,0));
  local_130 = 0;
  uStack_12c = 0;
  local_134 = 0;
  Image::Image((Image *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa90,
               SUB84((ulong)in_stack_fffffffffffffa88 >> 0x20,0));
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)0x12df34);
  local_158 = &local_c8;
  local_160._M_current =
       (BupChunk *)
       std::vector<BupChunk,_std::allocator<BupChunk>_>::begin
                 ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffa58);
  local_168 = (BupChunk *)
              std::vector<BupChunk,_std::allocator<BupChunk>_>::end
                        ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffa58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                             *)in_stack_fffffffffffffa60,
                            (__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                             *)in_stack_fffffffffffffa58), bVar1) {
    pBVar2 = __gnu_cxx::
             __normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>::
             operator*(&local_160);
    local_170 = pBVar2;
    pvVar3 = std::vector<BupChunk,_std::allocator<BupChunk>_>::operator[](&local_c8,0);
    local_178 = (long)pBVar2 - (long)pvVar3 >> 2;
    std::operator+(&in_stack_fffffffffffffa88->_M_pathname,(char *)in_stack_fffffffffffffa80);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffa98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa90);
    local_180 = processChunk(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                             in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20,
                             in_stack_fffffffffffffb18,(bool)in_stack_fffffffffffffb17);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_1c0);
    local_1e8 = local_180;
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
              (in_stack_fffffffffffffab0,
               (vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffaa8);
    Image::drawOnto(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb60,
                    in_stack_fffffffffffffb48);
    std::vector<MaskRect,_std::allocator<MaskRect>_>::~vector
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffa70);
    __gnu_cxx::__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>::
    operator++(&local_160);
  }
  if ((SHOULD_WRITE_DEBUG_IMAGES & 1U) != 0) {
    std::operator+(&in_stack_fffffffffffffa88->_M_pathname,(char *)in_stack_fffffffffffffa80);
    std::filesystem::__cxx11::path::path
              ((path *)in_stack_fffffffffffffa90,&in_stack_fffffffffffffa88->_M_pathname,
               (format)((ulong)in_stack_fffffffffffffa80 >> 0x38));
    std::filesystem::__cxx11::operator/(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (char *)in_stack_fffffffffffffa98,(allocator<char> *)in_stack_fffffffffffffa90);
    Image::writePNG((Image *)in_stack_fffffffffffffa70,
                    (path *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                    (string *)in_stack_fffffffffffffa60);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator(&local_291);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffa60);
    std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffa60);
    std::__cxx11::string::~string(local_270);
  }
  pBVar4 = std::unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_>::operator->
                     ((unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> *)0x12e402);
  std::filesystem::__cxx11::path::path
            (in_stack_fffffffffffffa70,
             (path *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  Image::Image((Image *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  std::__cxx11::string::string(local_300,local_58);
  (*pBVar4->_vptr_BupOutputter[2])(pBVar4,local_2c0,local_2e0,local_300);
  std::__cxx11::string::~string(local_300);
  Image::~Image((Image *)0x12e48c);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffa60);
  local_328 = 0;
  uStack_324 = 0;
  local_32c = 0;
  Image::Image((Image *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa90,
               SUB84((ulong)in_stack_fffffffffffffa88 >> 0x20,0));
  local_338 = auStack_b0;
  local_340._M_current =
       (BupExpressionChunk *)
       std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::begin
                 ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *)
                  in_stack_fffffffffffffa58);
  local_348 = (BupExpressionChunk *)
              std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::end
                        ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *)
                         in_stack_fffffffffffffa58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<BupExpressionChunk_*,_std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>_>
                             *)in_stack_fffffffffffffa60,
                            (__normal_iterator<BupExpressionChunk_*,_std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>_>
                             *)in_stack_fffffffffffffa58), bVar1) {
    local_350 = __gnu_cxx::
                __normal_iterator<BupExpressionChunk_*,_std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>_>
                ::operator*(&local_340);
    Image::operator=((Image *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    if ((local_350->face).offset == 0) {
      in_stack_fffffffffffffa90 =
           (Size)std::unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_>::operator->
                           ((unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> *)0x12e78f
                           );
      local_3ec = 0;
      Image::Image((Image *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa90,
                   SUB84((ulong)in_stack_fffffffffffffa88 >> 0x20,0));
      local_3f4 = 0;
      uStack_3f0 = 0;
      in_stack_fffffffffffffa88 = (path *)local_419;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                 (char *)in_stack_fffffffffffffa98,(allocator<char> *)in_stack_fffffffffffffa90);
      local_438._0_8_ = 0;
      local_438._8_8_ = 0;
      local_438._16_8_ = 0;
      in_stack_fffffffffffffa80 = (path *)local_438;
      std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
                ((vector<MaskRect,_std::allocator<MaskRect>_> *)0x12e83f);
      (**(code **)(*(long *)in_stack_fffffffffffffa90 + 0x18))
                (in_stack_fffffffffffffa90,&stack0xfffffffffffffc20,CONCAT44(uStack_3f0,local_3f4),
                 local_419 + 1,in_stack_fffffffffffffa80);
      std::vector<MaskRect,_std::allocator<MaskRect>_>::~vector
                ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffa70);
      std::__cxx11::string::~string((string *)(local_419 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_419);
      Image::~Image((Image *)0x12e8a0);
    }
    else {
      in_stack_fffffffffffffaa4 = (local_350->face).offset;
      in_stack_fffffffffffffaa8 = local_8;
      std::operator+(&in_stack_fffffffffffffa88->_M_pathname,(char *)in_stack_fffffffffffffa80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                     (char *)in_stack_fffffffffffffa60);
      in_stack_fffffffffffffa98 =
           processChunk(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                        in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20,
                        in_stack_fffffffffffffb18,(bool)in_stack_fffffffffffffb17);
      local_358 = in_stack_fffffffffffffa98;
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::string::~string(local_3b8);
      pBVar4 = std::unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_>::operator->
                         ((unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> *)0x12e664);
      (*pBVar4->_vptr_BupOutputter[3])(pBVar4,local_128,local_358,local_350,local_150);
    }
    local_439 = 0;
    for (local_440 = 0; uVar5 = (ulong)(int)local_440,
        sVar6 = std::vector<BupChunk,_std::allocator<BupChunk>_>::size(&local_350->mouths),
        uVar5 < sVar6; local_440 = local_440 + 1) {
      local_448 = std::vector<BupChunk,_std::allocator<BupChunk>_>::operator[]
                            (&local_350->mouths,(long)(int)local_440);
      if (local_448->offset != 0) {
        local_439 = 1;
        Image::Image((Image *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        in_stack_fffffffffffffa6c = local_448->offset;
        in_stack_fffffffffffffa70 = local_8;
        std::operator+(&in_stack_fffffffffffffa88->_M_pathname,(char *)in_stack_fffffffffffffa80);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                       (char *)in_stack_fffffffffffffa60);
        std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffa90);
        in_stack_fffffffffffffa60 =
             processChunk(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                          in_stack_fffffffffffffb2c,in_stack_fffffffffffffb20,
                          in_stack_fffffffffffffb18,(bool)in_stack_fffffffffffffb17);
        local_470 = in_stack_fffffffffffffa60;
        std::__cxx11::string::~string(local_490);
        std::__cxx11::string::~string(local_510);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffb50);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffb30);
        std::__cxx11::string::~string(local_4f0);
        pBVar4 = std::unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_>::operator->
                           ((unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> *)0x12ead9
                           );
        (*pBVar4->_vptr_BupOutputter[4])(pBVar4,local_128,local_470,(ulong)local_440,local_150);
        pBVar4 = std::unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_>::operator->
                           ((unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> *)0x12eb23
                           );
        (*pBVar4->_vptr_BupOutputter[5])();
        Image::~Image((Image *)0x12eb3e);
      }
    }
    if ((local_439 & 1) == 0) {
      pBVar4 = std::unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_>::operator->
                         ((unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> *)0x12ec46);
      (*pBVar4->_vptr_BupOutputter[5])();
    }
    __gnu_cxx::
    __normal_iterator<BupExpressionChunk_*,_std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>_>
    ::operator++(&local_340);
  }
  Image::~Image((Image *)0x12ec77);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::~vector
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffa70);
  Image::~Image((Image *)0x12ec91);
  Image::~Image((Image *)0x12ec9e);
  BupHeader::~BupHeader((BupHeader *)in_stack_fffffffffffffa60);
  std::unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_>::~unique_ptr
            ((unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> *)
             in_stack_fffffffffffffa70);
  std::__cxx11::string::~string(local_58);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffa60);
  return 0;
}

Assistant:

int processBup(std::istream &in, const fs::path &output) {
	fs::path outputDir = output.parent_path();
	std::string outTemplate = output.stem().string();

	std::unique_ptr<BupOutputter> out = SAVE_BUP_AS_PARTS ? BupOutputter::makeParts() : BupOutputter::makeComposited();

	BupHeader header;
	in >> header;

	Image base({header.width, header.height}), currentChunk({0, 0});
	std::vector<MaskRect> maskData;

	for (const auto& chunk : header.chunks) {
		size_t i = &chunk - &header.chunks[0];

		Point pos = processChunk(currentChunk, maskData, chunk.offset, in, outTemplate + "_BaseChunk" + std::to_string(i), header.isSwitch);

		currentChunk.drawOnto(base, pos, maskData);
	}
	if (SHOULD_WRITE_DEBUG_IMAGES) {
		base.writePNG(debugImagePath/(outTemplate + "_Base.png"));
	}

	out->setBase(outputDir, std::move(base), outTemplate);

	Image withEyes({0, 0});

	for (const auto& expChunk : header.expChunks) {
		withEyes = base;

		if (expChunk.face.offset) {
			Point facePos = processChunk(currentChunk, maskData, expChunk.face.offset, in, outTemplate + "_" + expChunk.name + "_Face", header.isSwitch);
			out->newFace(currentChunk, facePos, expChunk.name, maskData);
		} else {
			out->newFace(Image(), {0, 0}, "", {});
		}

		bool atLeastOneMouth = false;
		for (int i = 0; i < expChunk.mouths.size(); i++) {
			const auto& mouth = expChunk.mouths[i];

			if (!mouth.offset) { continue; }
			atLeastOneMouth = true;

			Image withMouth = withEyes;

			Point mouthPos = processChunk(currentChunk, maskData, mouth.offset, in, outTemplate + "_" + expChunk.name + "_Mouth" + std::to_string(i), header.isSwitch);
			out->newMouth(currentChunk, mouthPos, i, maskData);
			out->write();
		}
		if (!atLeastOneMouth) {
			out->write();
		}
	}

	return 0;
}